

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

bool __thiscall GameEngine::isPopulationExist(GameEngine *this,size_t posX,size_t posY)

{
  bool bVar1;
  element_type *this_00;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *this_01;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  size_t local_20;
  size_t posY_local;
  size_t posX_local;
  GameEngine *this_local;
  
  local_20 = posY;
  posY_local = posX;
  posX_local = (size_t)this;
  this_00 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  this_01 = Map::operator[](this_00,local_20);
  this_02 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
            operator[](this_01,posY_local);
  std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->(this_02);
  CellType::getCurrentPopulation((CellType *)&stack0xffffffffffffffd0);
  bVar1 = std::operator!=((shared_ptr<Population> *)&stack0xffffffffffffffd0,(nullptr_t)0x0);
  std::shared_ptr<Population>::~shared_ptr((shared_ptr<Population> *)&stack0xffffffffffffffd0);
  return bVar1;
}

Assistant:

bool GameEngine::isPopulationExist(size_t posX, size_t posY) {
  return (*map)[posY][posX]->getCurrentPopulation() != nullptr;
}